

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O1

gdIOCtx * gdNewDynamicCtxEx(int initialSize,void *data,int freeOKFlag)

{
  gdIOCtx *ptr;
  _func_int_gdIOCtx_ptr *ptr_00;
  
  ptr = (gdIOCtx *)gdMalloc(0x48);
  if (ptr == (gdIOCtx *)0x0) {
    return (gdIOCtx *)0x0;
  }
  ptr_00 = (_func_int_gdIOCtx_ptr *)gdMalloc(0x20);
  if (ptr_00 != (_func_int_gdIOCtx_ptr *)0x0) {
    if (data == (void *)0x0) {
      *(undefined4 *)(ptr_00 + 8) = 0;
      *(undefined4 *)(ptr_00 + 0x10) = 0;
      data = gdMalloc((long)initialSize);
    }
    else {
      *(int *)(ptr_00 + 8) = initialSize;
      *(undefined4 *)(ptr_00 + 0x10) = 1;
    }
    *(void **)ptr_00 = data;
    if (data != (void *)0x0) {
      *(int *)(ptr_00 + 0xc) = initialSize;
      *(undefined8 *)(ptr_00 + 0x10) = 1;
      *(int *)(ptr_00 + 0x18) = freeOKFlag;
      goto LAB_0011b45b;
    }
    *(undefined4 *)(ptr_00 + 0xc) = 0;
    gdFree(ptr_00);
  }
  ptr_00 = (_func_int_gdIOCtx_ptr *)0x0;
LAB_0011b45b:
  if (ptr_00 == (_func_int_gdIOCtx_ptr *)0x0) {
    gdFree(ptr);
    return (gdIOCtx *)0x0;
  }
  ptr[1].getC = ptr_00;
  ptr->getC = dynamicGetchar;
  ptr->putC = dynamicPutchar;
  ptr->getBuf = dynamicGetbuf;
  ptr->putBuf = dynamicPutbuf;
  ptr->seek = dynamicSeek;
  ptr->tell = dynamicTell;
  ptr->gd_free = gdFreeDynamicCtx;
  return ptr;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewDynamicCtxEx(int initialSize, void *data, int freeOKFlag)
{
	dpIOCtx *ctx;
	dynamicPtr *dp;

	ctx = (dpIOCtx *)gdMalloc(sizeof (dpIOCtx));
	if(ctx == NULL) {
		return NULL;
	}

	dp = newDynamic(initialSize, data, freeOKFlag);
	if(!dp) {
		gdFree (ctx);
		return NULL;
	};

	ctx->dp = dp;

	ctx->ctx.getC = dynamicGetchar;
	ctx->ctx.putC = dynamicPutchar;

	ctx->ctx.getBuf = dynamicGetbuf;
	ctx->ctx.putBuf = dynamicPutbuf;

	ctx->ctx.seek = dynamicSeek;
	ctx->ctx.tell = dynamicTell;

	ctx->ctx.gd_free = gdFreeDynamicCtx;

	return (gdIOCtx *)ctx;
}